

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

int __thiscall
QPDFJob::Config::decrypt
          (Config *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  element_type *peVar1;
  
  peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->decrypt = true;
  peVar1->encrypt = false;
  peVar1->copy_encryption = false;
  return (int)this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::decrypt()
{
    o.m->decrypt = true;
    o.m->encrypt = false;
    o.m->copy_encryption = false;
    return this;
}